

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::log_internal::ScopedMinLogLevel::~ScopedMinLogLevel(ScopedMinLogLevel *this)

{
  _ZN4absl12lts_2025012712_GLOBAL__N_113min_log_levelE_0 = this->saved_severity_;
  if (lts_20250127::(anonymous_namespace)::logging_globals_listener != (undefined *)0x0 &&
      (code *)lts_20250127::(anonymous_namespace)::logging_globals_listener !=
      base_internal::AtomicHook<void_(*)()>::DummyFunction) {
    (*(code *)lts_20250127::(anonymous_namespace)::logging_globals_listener)();
  }
  return;
}

Assistant:

ScopedMinLogLevel::~ScopedMinLogLevel() {
  absl::SetMinLogLevel(saved_severity_);
}